

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

void __thiscall pbrt::Transform::Transform(Transform *this,Quaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Float aFVar6 [4];
  ulong uVar7;
  int i;
  long lVar8;
  Float (*paFVar9) [4];
  int i_1;
  Transform *pTVar10;
  undefined8 *puVar11;
  int i_2;
  SquareMatrix<4> *pSVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  SquareMatrix<4> r;
  
  lVar8 = 0;
  auVar14 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  pTVar10 = this;
  do {
    auVar13 = vpbroadcastq_avx512vl();
    uVar7 = vpcmpeqq_avx512vl(auVar13,auVar14);
    auVar15 = vpmovm2d_avx512vl(uVar7 & 0xf);
    auVar15 = vpsrld_avx(auVar15,0x1f);
    aFVar6 = (Float  [4])vcvtdq2ps_avx(auVar15);
    (pTVar10->m).m[0] = aFVar6;
    lVar8 = lVar8 + 1;
    pTVar10 = (Transform *)((pTVar10->m).m + 1);
  } while (lVar8 != 4);
  pSVar12 = &this->mInv;
  lVar8 = 0;
  do {
    auVar13 = vpbroadcastq_avx512vl();
    uVar7 = vpcmpeqq_avx512vl(auVar13,auVar14);
    auVar15 = vpmovm2d_avx512vl(uVar7 & 0xf);
    auVar15 = vpsrld_avx(auVar15,0x1f);
    aFVar6 = (Float  [4])vcvtdq2ps_avx(auVar15);
    pSVar12->m[0] = aFVar6;
    lVar8 = lVar8 + 1;
    pSVar12 = (SquareMatrix<4> *)(pSVar12->m + 1);
  } while (lVar8 != 4);
  fVar1 = (q->v).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = (q->v).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar3 = (q->v).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar4 = q->w;
  auVar16 = SUB6416(ZEXT464(0x3f800000),0);
  auVar17 = SUB6416(ZEXT464(0xc0000000),0);
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3)),auVar17,auVar16);
  (this->mInv).m[0][0] = auVar15._0_4_;
  fVar5 = fVar1 * fVar2 + fVar4 * fVar3;
  (this->mInv).m[0][1] = fVar5 + fVar5;
  fVar5 = fVar1 * fVar3 - fVar4 * fVar2;
  (this->mInv).m[0][2] = fVar5 + fVar5;
  fVar5 = fVar1 * fVar2 - fVar4 * fVar3;
  (this->mInv).m[1][0] = fVar5 + fVar5;
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 + fVar3 * fVar3)),auVar17,auVar16);
  (this->mInv).m[1][1] = auVar15._0_4_;
  fVar5 = fVar2 * fVar3 + fVar4 * fVar1;
  (this->mInv).m[1][2] = fVar5 + fVar5;
  fVar5 = fVar1 * fVar3 + fVar4 * fVar2;
  (this->mInv).m[2][0] = fVar5 + fVar5;
  fVar3 = fVar2 * fVar3 - fVar4 * fVar1;
  (this->mInv).m[2][1] = fVar3 + fVar3;
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2)),auVar17,auVar16);
  (this->mInv).m[2][2] = auVar15._0_4_;
  paFVar9 = (Float (*) [4])&r;
  lVar8 = 0;
  do {
    auVar13 = vpbroadcastq_avx512vl();
    uVar7 = vpcmpeqq_avx512vl(auVar13,auVar14);
    auVar15 = vpmovm2d_avx512vl(uVar7 & 0xf);
    auVar15 = vpsrld_avx(auVar15,0x1f);
    auVar15 = vcvtdq2ps_avx(auVar15);
    *paFVar9 = (Float  [4])auVar15;
    lVar8 = lVar8 + 1;
    paFVar9 = paFVar9 + 1;
  } while (lVar8 != 4);
  auVar14 = vpbroadcastq_avx512vl();
  auVar14 = vpaddq_avx2(auVar14,_DAT_00462c00);
  paFVar9 = (Float (*) [4])&r;
  puVar11 = (undefined8 *)0x0;
  do {
    auVar13 = vpbroadcastq_avx512vl();
    auVar13 = vpsllq_avx2(auVar13,2);
    vpaddq_avx2(auVar14,auVar13);
    auVar15 = vgatherqps_avx512vl(*puVar11);
    *paFVar9 = (Float  [4])auVar15;
    puVar11 = (undefined8 *)((long)puVar11 + 1);
    paFVar9 = paFVar9 + 1;
  } while (puVar11 != (undefined8 *)0x4);
  *(undefined8 *)(this->m).m[0] = r.m[0]._0_8_;
  *(undefined8 *)((this->m).m[0] + 2) = r.m[0]._8_8_;
  *(undefined8 *)(this->m).m[1] = r.m[1]._0_8_;
  *(undefined8 *)((this->m).m[1] + 2) = r.m[1]._8_8_;
  *(undefined8 *)(this->m).m[2] = r.m[2]._0_8_;
  *(undefined8 *)((this->m).m[2] + 2) = r.m[2]._8_8_;
  *(undefined8 *)(this->m).m[3] = r.m[3]._0_8_;
  *(undefined8 *)((this->m).m[3] + 2) = r.m[3]._8_8_;
  return;
}

Assistant:

inline Transform::Transform(const Quaternion &q) {
    Float xx = q.v.x * q.v.x, yy = q.v.y * q.v.y, zz = q.v.z * q.v.z;
    Float xy = q.v.x * q.v.y, xz = q.v.x * q.v.z, yz = q.v.y * q.v.z;
    Float wx = q.v.x * q.w, wy = q.v.y * q.w, wz = q.v.z * q.w;

    mInv[0][0] = 1 - 2 * (yy + zz);
    mInv[0][1] = 2 * (xy + wz);
    mInv[0][2] = 2 * (xz - wy);
    mInv[1][0] = 2 * (xy - wz);
    mInv[1][1] = 1 - 2 * (xx + zz);
    mInv[1][2] = 2 * (yz + wx);
    mInv[2][0] = 2 * (xz + wy);
    mInv[2][1] = 2 * (yz - wx);
    mInv[2][2] = 1 - 2 * (xx + yy);

    // Transpose since we are left-handed.  Ugh.
    m = Transpose(mInv);
}